

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_filesystem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  path *ppVar4;
  ostream *poVar5;
  directory_iterator it;
  directory_iterator end;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    if ((((*pcVar1 == 'r') && (pcVar1[1] == 'm')) && (pcVar1[2] == '\0')) &&
       (((pcVar1 = argv[2], *pcVar1 == '-' && (pcVar1[1] == 'r')) && (pcVar1[2] == '\0')))) {
      Omega_h::filesystem::path::path((path *)&it,argv[3]);
      Omega_h::filesystem::remove_all((path *)&it);
LAB_0010142d:
      std::__cxx11::string::~string((string *)&it);
      return 0;
    }
  }
  else if (argc == 3) {
    pcVar1 = argv[1];
    if (((*pcVar1 == 'r') && (pcVar1[1] == 'm')) && (pcVar1[2] == '\0')) {
      Omega_h::filesystem::path::path((path *)&it,argv[2]);
      Omega_h::filesystem::remove((path *)&it);
      goto LAB_0010142d;
    }
  }
  else if (argc == 2) {
    pcVar1 = argv[1];
    iVar3 = strcmp(pcVar1,"pwd");
    if (iVar3 == 0) {
      Omega_h::filesystem::current_path();
      poVar5 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)&it);
      std::operator<<(poVar5,'\n');
      goto LAB_0010142d;
    }
    if (((*pcVar1 == 'l') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) {
      Omega_h::filesystem::current_path();
      Omega_h::filesystem::directory_iterator::directory_iterator(&it,(path *)&end);
      std::__cxx11::string::~string((string *)&end);
      Omega_h::filesystem::directory_iterator::directory_iterator(&end);
      while (bVar2 = Omega_h::filesystem::operator!=(&it,&end), bVar2) {
        ppVar4 = (path *)Omega_h::filesystem::directory_iterator::operator->(&it);
        poVar5 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,ppVar4);
        std::operator<<(poVar5,'\n');
        Omega_h::filesystem::directory_iterator::operator++(&it);
      }
      Omega_h::filesystem::directory_iterator::~directory_iterator(&end);
      Omega_h::filesystem::directory_iterator::~directory_iterator(&it);
      return 0;
    }
  }
  std::operator<<((ostream *)&std::cout,"usage: osh_filesystem pwd\n");
  std::operator<<((ostream *)&std::cout,"       osh_filesystem ls\n");
  std::operator<<((ostream *)&std::cout,"       osh_filesystem rm <file>\n");
  std::operator<<((ostream *)&std::cout,"       osh_filesystem rm -r <dir>\n");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2 && 0 == strcmp(argv[1], "pwd")) {
    std::cout << Omega_h::filesystem::current_path() << '\n';
  } else if (argc == 2 && 0 == strcmp(argv[1], "ls")) {
    for (Omega_h::filesystem::directory_iterator
             it(Omega_h::filesystem::current_path()),
         end;
         it != end; ++it) {
      std::cout << it->path() << '\n';
    }
  } else if (argc == 3 && 0 == strcmp(argv[1], "rm")) {
    Omega_h::filesystem::remove(argv[2]);
  } else if (argc == 4 && 0 == strcmp(argv[1], "rm") &&
             0 == strcmp(argv[2], "-r")) {
    Omega_h::filesystem::remove_all(argv[3]);
  } else {
    std::cout << "usage: osh_filesystem pwd\n";
    std::cout << "       osh_filesystem ls\n";
    std::cout << "       osh_filesystem rm <file>\n";
    std::cout << "       osh_filesystem rm -r <dir>\n";
  }
}